

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O1

void __thiscall
pybind11::detail::enum_base::value(enum_base *this,char *name_,object *value,char *doc)

{
  int iVar1;
  runtime_error *this_00;
  long *plVar2;
  PyObject *pPVar3;
  str name;
  dict entries;
  string type_name;
  allocator<char> local_e1;
  handle local_e0;
  handle local_d8;
  accessor<pybind11::detail::accessor_policies::str_attr> local_d0;
  undefined1 local_b0 [16];
  undefined1 local_a0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_b0._8_8_ = (this->m_base).m_ptr;
  local_a0._0_8_ = "__entries";
  local_a0._8_8_ = (PyObject *)0x0;
  dict::dict<pybind11::detail::accessor_policies::str_attr>
            ((dict *)&local_d8,(accessor<pybind11::detail::accessor_policies::str_attr> *)local_b0);
  object::~object((object *)(local_a0 + 8));
  str::str((str *)&local_e0,name_);
  iVar1 = PyDict_Contains(local_d8.m_ptr,local_e0.m_ptr);
  if (iVar1 != 1) {
    local_d0._0_8_ = (value->super_handle).m_ptr;
    if ((PyObject *)local_d0._0_8_ != (PyObject *)0x0) {
      ((PyObject *)local_d0._0_8_)->ob_refcnt = ((PyObject *)local_d0._0_8_)->ob_refcnt + 1;
    }
    if (local_e0.m_ptr != (PyObject *)0x0) {
      (local_e0.m_ptr)->ob_refcnt = (local_e0.m_ptr)->ob_refcnt + 1;
    }
    local_b0._8_8_ = local_d8.m_ptr;
    local_a0._0_8_ = local_e0.m_ptr;
    local_90._M_dataplus._M_p = (pointer)0x0;
    local_a0._8_8_ = (PyObject *)0x0;
    local_d0.obj.m_ptr = (PyObject *)doc;
    object::~object((object *)&local_90);
    accessor<pybind11::detail::accessor_policies::generic_item>::operator=
              ((accessor<pybind11::detail::accessor_policies::generic_item> *)local_b0,
               (pair<pybind11::object,_const_char_*> *)&local_d0);
    object::~object((object *)(local_a0 + 8));
    object::~object((object *)local_a0);
    object::~object((object *)&local_d0);
    local_b0._8_8_ = (this->m_base).m_ptr;
    if (local_e0.m_ptr != (PyObject *)0x0) {
      (local_e0.m_ptr)->ob_refcnt = (local_e0.m_ptr)->ob_refcnt + 1;
    }
    local_a0._0_8_ = local_e0.m_ptr;
    local_d0._0_8_ = (PyObject *)0x0;
    local_a0._8_8_ = (PyObject *)0x0;
    object::~object((object *)&local_d0);
    accessor_policies::obj_attr::set
              ((handle)local_b0._8_8_,(handle)local_a0._0_8_,(value->super_handle).m_ptr);
    object::~object((object *)(local_a0 + 8));
    object::~object((object *)local_a0);
    object::~object((object *)&local_e0);
    object::~object((object *)&local_d8);
    return;
  }
  local_d0.obj.m_ptr = (this->m_base).m_ptr;
  local_d0.key = "__name__";
  local_d0.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
  str::str<pybind11::detail::accessor_policies::str_attr>((str *)&local_90,&local_d0);
  str::operator_cast_to_string((string *)local_b0,(str *)&local_90);
  object::~object((object *)&local_90);
  object::~object(&local_d0.cache);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,
                 ": element \"");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,name_,&local_e1);
  std::operator+(&local_90,&local_50,&local_70);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_90);
  local_d0._0_8_ = *plVar2;
  pPVar3 = (PyObject *)(plVar2 + 2);
  if ((PyObject *)local_d0._0_8_ == pPVar3) {
    local_d0.key = (key_type)pPVar3->ob_refcnt;
    local_d0.cache.super_handle.m_ptr = (handle)plVar2[3];
    local_d0._0_8_ = &local_d0.key;
  }
  else {
    local_d0.key = (key_type)pPVar3->ob_refcnt;
  }
  local_d0.obj.m_ptr = (PyObject *)plVar2[1];
  *plVar2 = (long)pPVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::runtime_error::runtime_error(this_00,(string *)&local_d0);
  *(undefined ***)this_00 = &PTR__runtime_error_003855e0;
  __cxa_throw(this_00,&value_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

PYBIND11_NOINLINE void value(char const* name_, object value, const char *doc = nullptr) {
        dict entries = m_base.attr("__entries");
        str name(name_);
        if (entries.contains(name)) {
            std::string type_name = (std::string) str(m_base.attr("__name__"));
            throw value_error(type_name + ": element \"" + std::string(name_) + "\" already exists!");
        }

        entries[name] = std::make_pair(value, doc);
        m_base.attr(name) = value;
    }